

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilePool.cpp
# Opt level: O0

size_t __thiscall TilePool::allocateSector(TilePool *this)

{
  format_string_t<unsigned_long,_unsigned_long_&,_unsigned_long> fmt;
  format_string_t<unsigned_long,_unsigned_long> fmt_00;
  bool bVar1;
  unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_> *puVar2;
  reference pvVar3;
  size_type sVar4;
  size_t sVar5;
  char *pcVar6;
  vector<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
  *in_RDI;
  int j;
  size_t i;
  value_type_conflict7 *in_stack_ffffffffffffff48;
  bitset<64UL> *in_stack_ffffffffffffff50;
  vector<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
  *this_00;
  unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_> *__args;
  char *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  basic_string_view<char> local_88;
  undefined4 local_78;
  vector<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
  local_68;
  basic_string_view<char> local_50;
  int local_3c;
  unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_> *local_38;
  char *local_20;
  basic_string_view<char> *local_18;
  char *local_10;
  basic_string_view<char> *local_8;
  
  local_38 = (unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_> *)0x0;
  do {
    __args = local_38;
    puVar2 = (unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 1));
    if (puVar2 <= __args) {
      this_00 = &local_68;
      details::make_unique<TilePool::PoolItem,_0>();
      std::
      vector<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>,std::allocator<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>>>
      ::emplace_back<std::unique_ptr<TilePool::PoolItem,std::default_delete<TilePool::PoolItem>>>
                (in_RDI,__args);
      std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>::~unique_ptr
                ((unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_> *)in_RDI)
      ;
      std::
      vector<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
      ::back(this_00);
      std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>::operator->
                ((unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_> *)
                 0x20dc97);
      std::bitset<64UL>::set((bitset<64UL> *)in_RDI,(size_t)__args,SUB81((ulong)this_00 >> 0x38,0));
      local_78 = 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                 in_stack_ffffffffffffff48);
      local_8 = &local_88;
      local_10 = "TilePool allocating sector {} at end (items size is {}).";
      ::fmt::v11::basic_string_view<char>::basic_string_view
                (local_8,"TilePool allocating sector {} at end (items size is {}).",0x38);
      sVar4 = std::
              vector<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
              ::size(in_RDI);
      sVar5 = (sVar4 - 1) * 0x40;
      pcVar6 = (char *)std::
                       vector<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                       ::size(in_RDI);
      fmt_00.str.size_ = sVar5;
      fmt_00.str.data_ = pcVar6;
      spdlog::debug<unsigned_long,unsigned_long>
                (fmt_00,(unsigned_long *)in_RDI,(unsigned_long *)__args);
      sVar4 = std::
              vector<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
              ::size(in_RDI);
      return (sVar4 - 1) * 0x40;
    }
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 1),
                        (size_type)local_38);
    if (*pvVar3 < 0x40) {
      for (local_3c = 0; local_3c < 0x40; local_3c = local_3c + 1) {
        std::
        vector<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
        ::operator[](in_RDI,(size_type)local_38);
        std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>::operator->
                  ((unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_> *)
                   0x20db20);
        bVar1 = std::bitset<64UL>::test(in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48)
        ;
        if (!bVar1) {
          std::
          vector<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
          ::operator[](in_RDI,(size_type)local_38);
          std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>::operator->
                    ((unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_> *)
                     0x20db56);
          std::bitset<64UL>::set
                    ((bitset<64UL> *)in_RDI,(size_t)__args,
                     SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0));
          pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 1),
                              (size_type)local_38);
          *pvVar3 = *pvVar3 + 1;
          local_18 = &local_50;
          local_20 = "TilePool allocating sector {} at index {} (items size is {}).";
          ::fmt::v11::basic_string_view<char>::basic_string_view
                    (local_18,"TilePool allocating sector {} at index {} (items size is {}).",0x3d);
          local_68.
          super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)local_38 * 0x40 + (long)local_3c);
          local_68.
          super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)std::
                        vector<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                        ::size(in_RDI);
          fmt.str.size_ = in_stack_ffffffffffffff70;
          fmt.str.data_ = in_stack_ffffffffffffff68;
          spdlog::debug<unsigned_long,unsigned_long&,unsigned_long>
                    (fmt,(unsigned_long *)in_RDI,(unsigned_long *)__args,
                     (unsigned_long *)in_stack_ffffffffffffff50);
          return (long)local_38 * 0x40 + (long)local_3c;
        }
      }
    }
    local_38 = (unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_> *)
               ((long)&(local_38->_M_t).
                       super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_TilePool::PoolItem_*,_std::default_delete<TilePool::PoolItem>_>
                       .super__Head_base<0UL,_TilePool::PoolItem_*,_false>._M_head_impl + 1);
  } while( true );
}

Assistant:

size_t TilePool::allocateSector() {
    /*++upperId_;
    const auto itemIndex = static_cast<size_t>((upperId_ - baseId_) / CHUNK_AREA);
    if (itemIndex == items_.size()) {
        items_.emplace_back(details::make_unique<PoolItem>());
    }
    //spdlog::debug("TilePool allocating id {} at index {} (items size is {}).", upperId_, itemIndex, items_.size());

    PoolItem* item = items_[itemIndex].get();
    item->allocated.set(upperId_ % CHUNK_AREA);
    ++item->allocatedCount;
    return {
        item->chunk.accessTile(upperId_ % CHUNK_AREA),
        upperId_
    };*/

    for (size_t i = 0; i < itemsAllocatedCount_.size(); ++i) {
        if (itemsAllocatedCount_[i] < SECTORS_PER_CHUNK) {
            for (int j = 0; j < SECTORS_PER_CHUNK; ++j) {
                if (!items_[i]->allocated.test(j)) {
                    items_[i]->allocated.set(j);
                    ++itemsAllocatedCount_[i];
                    spdlog::debug("TilePool allocating sector {} at index {} (items size is {}).", i * SECTORS_PER_CHUNK + j, i, items_.size());
                    return i * SECTORS_PER_CHUNK + j;
                }
            }
        }
    }
    items_.emplace_back(details::make_unique<PoolItem>());
    items_.back()->allocated.set(0);
    itemsAllocatedCount_.push_back(1);
    spdlog::debug("TilePool allocating sector {} at end (items size is {}).", (items_.size() - 1) * SECTORS_PER_CHUNK, items_.size());
    return (items_.size() - 1) * SECTORS_PER_CHUNK;
}